

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

size_t art_size_in_bytes(art_t *art)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  if (art->first_free[1] == art->capacities[1]) {
    lVar3 = 0;
    do {
      lVar2 = lVar3;
      if (lVar2 == 4) break;
      lVar3 = lVar2 + 1;
    } while (art->first_free[lVar2 + 2] == art->capacities[lVar2 + 2]);
    if (4 < lVar2 + 1U) {
      sVar1 = 0x38;
      lVar3 = 0;
      do {
        sVar1 = sVar1 + ART_NODE_SIZES[lVar3 + 1] * art->capacities[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 5);
      return sVar1;
    }
  }
  return 0;
}

Assistant:

size_t art_size_in_bytes(const art_t *art) {
    if (!art_is_shrunken(art)) {
        return 0;
    }
    // Root.
    size_t size = sizeof(art->root);
    // Node counts.
    size += sizeof(art->capacities);
    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size +=
        ((size + alignof(art_leaf_t) - 1) & ~(alignof(art_leaf_t) - 1)) - size;
    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        size += art->capacities[t] * ART_NODE_SIZES[t];
    }
    return size;
}